

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int ncnn::
    reduction<ncnn::reduction_op_asum<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_d,bool reduce_c,
              bool post_process,float coeff,int keepdims,Option *opt)

{
  int iVar1;
  size_t sVar2;
  Allocator *pAVar3;
  size_t sVar4;
  int *piVar5;
  bool bVar6;
  int j_3;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Mat *pMVar11;
  Mat *pMVar12;
  Mat *pMVar13;
  void *pvVar14;
  void *pvVar15;
  undefined7 in_register_00000009;
  Mat *pMVar16;
  Mat *pMVar17;
  Mat *pMVar18;
  Mat *pMVar19;
  undefined7 in_register_00000011;
  Mat *pMVar20;
  void *pvVar21;
  long lVar22;
  void *pvVar23;
  float *mins_ptr;
  Mat *pMVar24;
  char cVar25;
  byte bVar26;
  byte bVar27;
  Mat *pMVar28;
  size_t sVar29;
  void *pvVar30;
  undefined7 in_register_00000089;
  void *pvVar31;
  bool bVar32;
  int j;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  uint uVar36;
  int j_2;
  uint uVar37;
  size_t sVar38;
  long lVar39;
  float fVar40;
  undefined3 in_stack_00000009;
  undefined4 in_stack_00000014;
  int size;
  Mat local_98;
  void *local_48;
  size_t local_40;
  float local_34;
  
  pMVar28 = b;
  local_34 = v0;
  if (3 < a->dims - 1U) goto LAB_003497f4;
  lVar22 = CONCAT44(in_stack_00000014,keepdims);
  sVar2 = a->elemsize;
  switch(a->dims) {
  case 1:
    iVar35 = a->w;
    pMVar28 = (Mat *)0x1;
    Mat::create(b,1,sVar2,*(Allocator **)(lVar22 + 8));
    if ((long)iVar35 < 1) {
      fVar40 = 0.0;
    }
    else {
      fVar40 = 0.0;
      lVar22 = 0;
      do {
        fVar40 = fVar40 + ABS(*(float *)((long)a->data + lVar22 * 4));
        lVar22 = lVar22 + 1;
      } while (iVar35 != lVar22);
    }
    *(float *)b->data = fVar40;
    goto LAB_003497f4;
  case 2:
    uVar7 = a->w;
    pMVar16 = (Mat *)(ulong)uVar7;
    uVar9 = a->h;
    pMVar11 = (Mat *)(ulong)uVar9;
    uVar34 = CONCAT71(in_register_00000011,reduce_w) & 0xffffffff;
    bVar27 = (byte)uVar34 ^ 1;
    pMVar28 = pMVar11;
    if (bVar27 != 0 || !reduce_h) {
      bVar27 = bVar27 | reduce_h;
      if (bVar27 == 0) {
        if (_post_process == 0) {
          Mat::create(b,uVar9,sVar2,*(Allocator **)(lVar22 + 8));
        }
        else {
          pMVar28 = (Mat *)0x1;
          Mat::create(b,1,uVar9,sVar2,*(Allocator **)(lVar22 + 8));
        }
        if (0 < (int)uVar9) {
          iVar35 = a->w;
          sVar2 = a->elemsize;
          pvVar14 = a->data;
          pvVar31 = b->data;
          pMVar28 = (Mat *)0x0;
          do {
            fVar40 = 0.0;
            if (0 < (int)uVar7) {
              pMVar17 = (Mat *)0x0;
              do {
                fVar40 = fVar40 + ABS(*(float *)((long)pvVar14 + (long)pMVar17 * 4));
                pMVar17 = (Mat *)((long)&pMVar17->data + 1);
              } while (pMVar16 != pMVar17);
            }
            *(float *)((long)pvVar31 + (long)pMVar28 * 4) = fVar40;
            pMVar28 = (Mat *)((long)&pMVar28->data + 1);
            pvVar14 = (void *)((long)pvVar14 + (long)iVar35 * sVar2);
          } while (pMVar28 != pMVar11);
        }
      }
      else {
        pMVar28 = (Mat *)CONCAT71((int7)(uVar34 >> 8),bVar27);
        if (reduce_h && !reduce_w) {
          pMVar28 = pMVar16;
          if (_post_process == 0) {
            Mat::create(b,uVar7,sVar2,*(Allocator **)(lVar22 + 8));
          }
          else {
            Mat::create(b,uVar7,1,sVar2,*(Allocator **)(lVar22 + 8));
          }
          uVar8 = b->c * (int)b->cstep;
          pvVar14 = b->data;
          if (0 < (int)uVar8) {
            pMVar28 = (Mat *)0x0;
            memset(pvVar14,0,(ulong)uVar8 << 2);
          }
          if (0 < (int)uVar9) {
            pvVar31 = a->data;
            iVar35 = a->w;
            sVar2 = a->elemsize;
            pMVar17 = (Mat *)0x0;
            do {
              if (0 < (int)uVar7) {
                pMVar28 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar14 + (long)pMVar28 * 4) =
                       ABS(*(float *)((long)pvVar31 + (long)pMVar28 * 4)) +
                       *(float *)((long)pvVar14 + (long)pMVar28 * 4);
                  pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                } while (pMVar16 != pMVar28);
              }
              pMVar17 = (Mat *)((long)&pMVar17->data + 1);
              pvVar31 = (void *)((long)pvVar31 + (long)iVar35 * sVar2);
            } while (pMVar17 != pMVar11);
          }
        }
      }
      goto LAB_003497f4;
    }
    if (_post_process == 0) {
      Mat::create(b,1,sVar2,*(Allocator **)(lVar22 + 8));
    }
    else {
      Mat::create(b,1,1,sVar2,*(Allocator **)(lVar22 + 8));
    }
    local_98.cstep = 0;
    local_98.data = (Mat *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.allocator = (Allocator *)0x0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
    Mat::create(&local_98,uVar9,sVar2,*(Allocator **)(lVar22 + 0x10));
    iVar35 = -100;
    if (((Mat *)local_98.data != (Mat *)0x0) && ((long)local_98.c * local_98.cstep != 0)) {
      if ((int)uVar9 < 1) {
        fVar40 = 0.0;
      }
      else {
        pvVar14 = a->data;
        iVar35 = a->w;
        sVar2 = a->elemsize;
        pMVar28 = (Mat *)0x0;
        do {
          fVar40 = 0.0;
          if (0 < (int)uVar7) {
            pMVar17 = (Mat *)0x0;
            do {
              fVar40 = fVar40 + ABS(*(float *)((long)pvVar14 + (long)pMVar17 * 4));
              pMVar17 = (Mat *)((long)&pMVar17->data + 1);
            } while (pMVar16 != pMVar17);
          }
          *(float *)((long)(void **)local_98.data + (long)pMVar28 * 4) = fVar40;
          pMVar28 = (Mat *)((long)&pMVar28->data + 1);
          pvVar14 = (void *)((long)pvVar14 + (long)iVar35 * sVar2);
        } while (pMVar28 != pMVar11);
        fVar40 = 0.0;
        pMVar16 = (Mat *)0x0;
        do {
          fVar40 = fVar40 + *(float *)((long)(void **)local_98.data + (long)pMVar16 * 4);
          pMVar16 = (Mat *)((long)&pMVar16->data + 1);
        } while (pMVar11 != pMVar16);
      }
      *(float *)b->data = fVar40;
      iVar35 = 0;
    }
    piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
LAB_00348c34:
          pMVar28 = (Mat *)local_98.data;
          if ((Mat *)local_98.data != (Mat *)0x0) {
            free(local_98.data);
          }
        }
        else {
          pMVar28 = (Mat *)local_98.data;
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    break;
  case 3:
    uVar7 = a->w;
    lVar22 = (long)(int)uVar7;
    uVar9 = a->h;
    uVar34 = (ulong)uVar9;
    uVar8 = a->c;
    pMVar16 = (Mat *)(ulong)uVar8;
    uVar10 = uVar9 * uVar7;
    pMVar11 = (Mat *)(ulong)uVar10;
    bVar6 = !reduce_h;
    pMVar28 = (Mat *)(CONCAT71(in_register_00000089,reduce_c) & 0xffffffff ^ 1);
    cVar25 = (char)pMVar28;
    if ((reduce_w && !bVar6) && cVar25 == '\0') {
      pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
      if (_post_process == 0) {
        Mat::create(b,1,sVar2,pAVar3);
      }
      else {
        Mat::create(b,1,1,1,sVar2,pAVar3);
      }
      local_98.cstep = 0;
      local_98.data = (Mat *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.elemsize._0_4_ = 0;
      local_98.elemsize._4_4_ = 0;
      local_98.elempack = 0;
      local_98.allocator = (Allocator *)0x0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.d = 0;
      local_98.c = 0;
      pMVar28 = pMVar16;
      Mat::create(&local_98,uVar8,sVar2,*(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10)
                 );
      iVar35 = -100;
      if (((Mat *)local_98.data != (Mat *)0x0) && ((long)local_98.c * local_98.cstep != 0)) {
        if ((int)uVar8 < 1) {
          fVar40 = 0.0;
          pMVar11 = pMVar28;
        }
        else {
          sVar2 = a->elemsize;
          sVar38 = a->cstep;
          pvVar14 = a->data;
          pMVar28 = (Mat *)0x0;
          do {
            fVar40 = 0.0;
            if (0 < (int)uVar10) {
              pMVar17 = (Mat *)0x0;
              do {
                fVar40 = fVar40 + ABS(*(float *)((long)pvVar14 + (long)pMVar17 * 4));
                pMVar17 = (Mat *)((long)&pMVar17->data + 1);
              } while (pMVar11 != pMVar17);
            }
            *(float *)((long)(void **)local_98.data + (long)pMVar28 * 4) = fVar40;
            pMVar28 = (Mat *)((long)&pMVar28->data + 1);
            pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar38);
          } while (pMVar28 != pMVar16);
          fVar40 = 0.0;
          pMVar28 = (Mat *)0x0;
          do {
            fVar40 = fVar40 + *(float *)((long)(void **)local_98.data + (long)pMVar28 * 4);
            pMVar28 = (Mat *)((long)&pMVar28->data + 1);
          } while (pMVar16 != pMVar28);
        }
        *(float *)b->data = fVar40;
        iVar35 = 0;
        pMVar28 = pMVar11;
      }
      piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_98.allocator == (Allocator *)0x0) goto LAB_00348c34;
          pMVar28 = (Mat *)local_98.data;
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else {
      if ((reduce_w && !bVar6) && !reduce_c) {
        pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
        if (_post_process == 0) {
          pMVar28 = pMVar16;
          Mat::create(b,uVar8,sVar2,pAVar3);
        }
        else {
          pMVar28 = (Mat *)0x1;
          Mat::create(b,1,1,uVar8,sVar2,pAVar3);
        }
        if (0 < (int)uVar8) {
          pvVar14 = a->data;
          sVar2 = a->elemsize;
          pvVar31 = b->data;
          pMVar28 = (Mat *)(b->elemsize * b->cstep);
          sVar38 = a->cstep;
          pMVar17 = (Mat *)0x0;
          do {
            fVar40 = 0.0;
            if (0 < (int)uVar10) {
              pMVar18 = (Mat *)0x0;
              do {
                fVar40 = fVar40 + ABS(*(float *)((long)pvVar14 + (long)pMVar18 * 4));
                pMVar18 = (Mat *)((long)&pMVar18->data + 1);
              } while (pMVar11 != pMVar18);
            }
            lVar22 = (long)pMVar28 * (long)pMVar17;
            if (_post_process == 0) {
              lVar22 = (long)pMVar17 * 4;
            }
            *(float *)((long)pvVar31 + lVar22) = fVar40;
            pMVar17 = (Mat *)((long)&pMVar17->data + 1);
            pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar38);
          } while (pMVar17 != pMVar16);
        }
        goto LAB_003497f4;
      }
      pMVar17 = (Mat *)(ulong)uVar7;
      if ((reduce_w && !reduce_h) && cVar25 == '\0') {
        pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
        if (_post_process == 0) {
          Mat::create(b,uVar9,sVar2,pAVar3);
        }
        else {
          Mat::create(b,1,uVar9,1,sVar2,pAVar3);
        }
        local_98.cstep = 0;
        local_98.data = (Mat *)0x0;
        local_98.refcount._0_4_ = 0;
        local_98.refcount._4_4_ = 0;
        local_98.elemsize._0_4_ = 0;
        local_98.elemsize._4_4_ = 0;
        local_98.elempack = 0;
        local_98.allocator = (Allocator *)0x0;
        local_98.dims = 0;
        local_98.w = 0;
        local_98.h = 0;
        local_98.d = 0;
        local_98.c = 0;
        pMVar28 = (Mat *)0x1;
        Mat::create(&local_98,1,uVar9,uVar8,sVar2,
                    *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
        sVar2 = local_98.cstep;
        pMVar11 = (Mat *)local_98.data;
        iVar35 = -100;
        if (((Mat *)local_98.data != (Mat *)0x0) && (local_98.cstep * (long)local_98.c != 0)) {
          uVar10 = (int)local_98.cstep * local_98.c;
          if (0 < (int)uVar10) {
            pMVar28 = (Mat *)0x0;
            memset(local_98.data,0,(ulong)uVar10 << 2);
          }
          if (0 < (int)uVar8) {
            pvVar14 = a->data;
            sVar38 = a->elemsize;
            sVar29 = a->cstep;
            pMVar28 = (Mat *)(lVar22 * 4);
            pMVar18 = (Mat *)0x0;
            do {
              if (0 < (int)uVar9) {
                uVar33 = 0;
                pvVar31 = pvVar14;
                do {
                  fVar40 = 0.0;
                  if (0 < (int)uVar7) {
                    pMVar20 = (Mat *)0x0;
                    do {
                      fVar40 = fVar40 + ABS(*(float *)((long)pvVar31 + (long)pMVar20 * 4));
                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    } while (pMVar17 != pMVar20);
                  }
                  *(float *)((long)&pMVar11->data +
                            uVar33 * 4 +
                            CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) * sVar2
                            * (long)pMVar18) = fVar40;
                  uVar33 = uVar33 + 1;
                  pvVar31 = (void *)((long)&pMVar28->data + (long)pvVar31);
                } while (uVar33 != uVar34);
              }
              pMVar18 = (Mat *)((long)&pMVar18->data + 1);
              pvVar14 = (void *)((long)pvVar14 + sVar38 * sVar29);
            } while (pMVar18 != pMVar16);
          }
          uVar7 = b->c * (int)b->cstep;
          if (0 < (int)uVar7) {
            pMVar28 = (Mat *)0x0;
            memset(b->data,0,(ulong)uVar7 << 2);
          }
          if (0 < (int)uVar8) {
            pMVar28 = (Mat *)(sVar2 * CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize
                                              ));
            pvVar14 = b->data;
            pMVar17 = (Mat *)0x0;
            do {
              if (0 < (int)uVar9) {
                uVar33 = 0;
                do {
                  *(float *)((long)pvVar14 + uVar33 * 4) =
                       *(float *)((long)&pMVar11->data + uVar33 * 4) +
                       *(float *)((long)pvVar14 + uVar33 * 4);
                  uVar33 = uVar33 + 1;
                } while (uVar34 != uVar33);
              }
              pMVar17 = (Mat *)((long)&pMVar17->data + 1);
              pMVar11 = (Mat *)((long)&pMVar28->data + (long)&pMVar11->data);
            } while (pMVar17 != pMVar16);
          }
          iVar35 = 0;
        }
        piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
LAB_003497d3:
              pMVar28 = (Mat *)local_98.data;
              if ((Mat *)local_98.data != (Mat *)0x0) {
                free(local_98.data);
              }
            }
            else {
              pMVar28 = (Mat *)local_98.data;
              (*(local_98.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        if ((bVar6 || reduce_w) || cVar25 != '\0') {
          if ((reduce_w && !reduce_h) && !reduce_c) {
            pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
            if (_post_process == 0) {
              pMVar28 = (Mat *)(ulong)uVar9;
              Mat::create(b,uVar9,uVar8,sVar2,pAVar3);
            }
            else {
              pMVar28 = (Mat *)0x1;
              Mat::create(b,1,uVar9,uVar8,sVar2,pAVar3);
            }
            if (0 < (int)uVar8) {
              sVar2 = a->elemsize;
              if (_post_process == 0) {
                sVar38 = (size_t)b->w;
              }
              else {
                sVar38 = b->cstep;
              }
              pvVar14 = a->data;
              sVar29 = b->elemsize;
              sVar4 = a->cstep;
              pMVar28 = (Mat *)b->data;
              pMVar11 = (Mat *)0x0;
              do {
                if (0 < (int)uVar9) {
                  uVar33 = 0;
                  pvVar31 = pvVar14;
                  do {
                    fVar40 = 0.0;
                    if (0 < (int)uVar7) {
                      pMVar18 = (Mat *)0x0;
                      do {
                        fVar40 = fVar40 + ABS(*(float *)((long)pvVar31 + (long)pMVar18 * 4));
                        pMVar18 = (Mat *)((long)&pMVar18->data + 1);
                      } while (pMVar17 != pMVar18);
                    }
                    *(float *)((long)&pMVar28->data + uVar33 * 4 + sVar38 * sVar29 * (long)pMVar11)
                         = fVar40;
                    uVar33 = uVar33 + 1;
                    pvVar31 = (void *)((long)pvVar31 + lVar22 * 4);
                  } while (uVar33 != uVar34);
                }
                pMVar11 = (Mat *)((long)&pMVar11->data + 1);
                pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar4);
              } while (pMVar11 != pMVar16);
            }
          }
          else if ((reduce_w || reduce_h) || cVar25 != '\0') {
            if ((!bVar6 && !reduce_w) && !reduce_c) {
              pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
              if (_post_process == 0) {
                pMVar28 = pMVar17;
                Mat::create(b,uVar7,uVar8,sVar2,pAVar3);
              }
              else {
                pMVar28 = (Mat *)(ulong)uVar7;
                Mat::create(b,uVar7,1,uVar8,sVar2,pAVar3);
              }
              uVar10 = b->c * (int)b->cstep;
              if (0 < (int)uVar10) {
                pMVar28 = (Mat *)0x0;
                memset(b->data,0,(ulong)uVar10 << 2);
              }
              if (0 < (int)uVar8) {
                sVar2 = a->elemsize;
                if (_post_process == 0) {
                  sVar38 = (size_t)b->w;
                }
                else {
                  sVar38 = b->cstep;
                }
                pMVar28 = (Mat *)a->data;
                sVar29 = b->elemsize;
                sVar4 = a->cstep;
                pvVar14 = b->data;
                pMVar11 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar9) {
                    uVar8 = 0;
                    pMVar18 = pMVar28;
                    do {
                      if (0 < (int)uVar7) {
                        pMVar20 = (Mat *)0x0;
                        do {
                          *(float *)((long)pvVar14 + (long)pMVar20 * 4) =
                               ABS(*(float *)((long)&pMVar18->data + (long)pMVar20 * 4)) +
                               *(float *)((long)pvVar14 + (long)pMVar20 * 4);
                          pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                        } while (pMVar17 != pMVar20);
                      }
                      uVar8 = uVar8 + 1;
                      pMVar18 = (Mat *)((long)&pMVar18->data + (long)(int)uVar7 * 4);
                    } while (uVar8 != uVar9);
                  }
                  pMVar11 = (Mat *)((long)&pMVar11->data + 1);
                  pMVar28 = (Mat *)((long)&pMVar28->data + sVar2 * sVar4);
                  pvVar14 = (void *)((long)pvVar14 + sVar38 * sVar29);
                } while (pMVar11 != pMVar16);
              }
            }
          }
          else {
            pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
            if (_post_process == 0) {
              Mat::create(b,uVar7,uVar9,sVar2,pAVar3);
            }
            else {
              Mat::create(b,uVar7,uVar9,1,sVar2,pAVar3);
            }
            uVar7 = b->c * (int)b->cstep;
            if (0 < (int)uVar7) {
              pMVar17 = (Mat *)0x0;
              memset(b->data,0,(ulong)uVar7 << 2);
            }
            pMVar28 = pMVar17;
            if (0 < (int)uVar8) {
              pvVar14 = a->data;
              sVar2 = a->elemsize;
              sVar38 = a->cstep;
              pvVar31 = b->data;
              pMVar17 = (Mat *)0x0;
              do {
                if (0 < (int)uVar10) {
                  pMVar28 = (Mat *)0x0;
                  do {
                    *(float *)((long)pvVar31 + (long)pMVar28 * 4) =
                         ABS(*(float *)((long)pvVar14 + (long)pMVar28 * 4)) +
                         *(float *)((long)pvVar31 + (long)pMVar28 * 4);
                    pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                  } while (pMVar11 != pMVar28);
                }
                pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar38);
                pMVar28 = pMVar11;
              } while (pMVar17 != pMVar16);
            }
          }
          goto LAB_003497f4;
        }
        pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
        if (_post_process == 0) {
          Mat::create(b,uVar7,sVar2,pAVar3);
        }
        else {
          Mat::create(b,uVar7,1,1,sVar2,pAVar3);
        }
        local_98.cstep = 0;
        local_98.data = (Mat *)0x0;
        local_98.refcount._0_4_ = 0;
        local_98.refcount._4_4_ = 0;
        local_98.elemsize._0_4_ = 0;
        local_98.elemsize._4_4_ = 0;
        local_98.elempack = 0;
        local_98.allocator = (Allocator *)0x0;
        local_98.dims = 0;
        local_98.w = 0;
        local_98.h = 0;
        local_98.d = 0;
        local_98.c = 0;
        pMVar28 = pMVar17;
        Mat::create(&local_98,uVar7,1,uVar8,sVar2,
                    *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
        sVar2 = local_98.cstep;
        pMVar11 = (Mat *)local_98.data;
        iVar35 = -100;
        if (((Mat *)local_98.data != (Mat *)0x0) && (local_98.cstep * (long)local_98.c != 0)) {
          uVar10 = (int)local_98.cstep * local_98.c;
          if (0 < (int)uVar10) {
            pMVar28 = (Mat *)0x0;
            memset(local_98.data,0,(ulong)uVar10 << 2);
          }
          if (0 < (int)uVar8) {
            sVar38 = a->elemsize;
            sVar29 = a->cstep;
            pvVar14 = a->data;
            pMVar28 = (Mat *)(CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) *
                             sVar2);
            pMVar20 = (Mat *)0x0;
            pMVar18 = pMVar11;
            do {
              if (0 < (int)uVar9) {
                uVar10 = 0;
                pvVar31 = pvVar14;
                do {
                  if (0 < (int)uVar7) {
                    pMVar24 = (Mat *)0x0;
                    do {
                      *(float *)((long)&pMVar18->data + (long)pMVar24 * 4) =
                           ABS(*(float *)((long)pvVar31 + (long)pMVar24 * 4)) +
                           *(float *)((long)&pMVar18->data + (long)pMVar24 * 4);
                      pMVar24 = (Mat *)((long)&pMVar24->data + 1);
                    } while (pMVar17 != pMVar24);
                  }
                  uVar10 = uVar10 + 1;
                  pvVar31 = (void *)((long)pvVar31 + lVar22 * 4);
                } while (uVar10 != uVar9);
              }
              pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              pvVar14 = (void *)((long)pvVar14 + sVar38 * sVar29);
              pMVar18 = (Mat *)((long)&pMVar28->data + (long)&pMVar18->data);
            } while (pMVar20 != pMVar16);
          }
          uVar9 = b->c * (int)b->cstep;
          if (0 < (int)uVar9) {
            pMVar28 = (Mat *)0x0;
            memset(b->data,0,(ulong)uVar9 << 2);
          }
          if (0 < (int)uVar8) {
            pMVar28 = (Mat *)(sVar2 * CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize
                                              ));
            pvVar14 = b->data;
            pMVar18 = (Mat *)0x0;
            do {
              if (0 < (int)uVar7) {
                pMVar20 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar14 + (long)pMVar20 * 4) =
                       *(float *)((long)&pMVar11->data + (long)pMVar20 * 4) +
                       *(float *)((long)pvVar14 + (long)pMVar20 * 4);
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                } while (pMVar17 != pMVar20);
              }
              pMVar18 = (Mat *)((long)&pMVar18->data + 1);
              pMVar11 = (Mat *)((long)&pMVar28->data + (long)&pMVar11->data);
            } while (pMVar18 != pMVar16);
          }
          iVar35 = 0;
        }
        piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_98.allocator == (Allocator *)0x0) goto LAB_003497d3;
            pMVar28 = (Mat *)local_98.data;
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    break;
  case 4:
    uVar7 = a->w;
    lVar22 = (long)(int)uVar7;
    uVar9 = a->h;
    pMVar17 = (Mat *)(ulong)uVar9;
    uVar8 = a->d;
    pMVar16 = (Mat *)(ulong)uVar8;
    uVar10 = a->c;
    pMVar11 = (Mat *)(ulong)uVar10;
    uVar37 = uVar9 * uVar7;
    uVar36 = uVar37 * uVar8;
    uVar34 = CONCAT71(in_register_00000009,reduce_h) & 0xffffffff;
    bVar27 = (byte)uVar34 ^ 1;
    bVar6 = !reduce_d;
    bVar32 = !reduce_c;
    pMVar28 = pMVar11;
    if (((reduce_w && bVar27 == 0) && !bVar6) && !bVar32) {
      pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
      if (_post_process == 0) {
        Mat::create(b,1,sVar2,pAVar3);
      }
      else {
        Mat::create(b,1,1,1,1,sVar2,pAVar3);
      }
      local_98.cstep = 0;
      local_98.data = (Mat *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.elemsize._0_4_ = 0;
      local_98.elemsize._4_4_ = 0;
      local_98.elempack = 0;
      local_98.allocator = (Allocator *)0x0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.d = 0;
      local_98.c = 0;
      Mat::create(&local_98,uVar10,sVar2,
                  *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
      iVar35 = -100;
      if (((Mat *)local_98.data != (Mat *)0x0) && ((long)local_98.c * local_98.cstep != 0)) {
        if ((int)uVar10 < 1) {
          fVar40 = 0.0;
        }
        else {
          sVar2 = a->elemsize;
          sVar38 = a->cstep;
          pvVar14 = a->data;
          pMVar28 = (Mat *)(ulong)uVar36;
          pMVar16 = (Mat *)0x0;
          do {
            fVar40 = 0.0;
            if (0 < (int)uVar36) {
              pMVar17 = (Mat *)0x0;
              do {
                fVar40 = fVar40 + ABS(*(float *)((long)pvVar14 + (long)pMVar17 * 4));
                pMVar17 = (Mat *)((long)&pMVar17->data + 1);
              } while (pMVar28 != pMVar17);
            }
            *(float *)((long)(void **)local_98.data + (long)pMVar16 * 4) = fVar40;
            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
            pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar38);
          } while (pMVar16 != pMVar11);
          fVar40 = 0.0;
          pMVar16 = (Mat *)0x0;
          do {
            fVar40 = fVar40 + *(float *)((long)(void **)local_98.data + (long)pMVar16 * 4);
            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
          } while (pMVar11 != pMVar16);
        }
        *(float *)b->data = fVar40;
        iVar35 = 0;
      }
      piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_98.allocator == (Allocator *)0x0) goto LAB_00348c34;
          pMVar28 = (Mat *)local_98.data;
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else {
      if (((reduce_w && bVar27 == 0) && !bVar6) && !reduce_c) {
        pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
        if (_post_process == 0) {
          Mat::create(b,uVar10,sVar2,pAVar3);
        }
        else {
          pMVar28 = (Mat *)0x1;
          Mat::create(b,1,1,1,uVar10,sVar2,pAVar3);
        }
        if (0 < (int)uVar10) {
          pvVar14 = a->data;
          sVar2 = a->elemsize;
          pvVar31 = b->data;
          pMVar28 = (Mat *)(b->elemsize * b->cstep);
          sVar38 = a->cstep;
          pMVar16 = (Mat *)0x0;
          do {
            fVar40 = 0.0;
            if (0 < (int)uVar36) {
              uVar34 = 0;
              do {
                fVar40 = fVar40 + ABS(*(float *)((long)pvVar14 + uVar34 * 4));
                uVar34 = uVar34 + 1;
              } while (uVar36 != uVar34);
            }
            lVar22 = (long)pMVar28 * (long)pMVar16;
            if (_post_process == 0) {
              lVar22 = (long)pMVar16 * 4;
            }
            *(float *)((long)pvVar31 + lVar22) = fVar40;
            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
            pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar38);
          } while (pMVar16 != pMVar11);
        }
        goto LAB_003497f4;
      }
      if (((reduce_w && bVar27 == 0) && !reduce_d) && !bVar32) {
        pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
        if (_post_process == 0) {
          Mat::create(b,uVar8,sVar2,pAVar3);
        }
        else {
          Mat::create(b,1,1,uVar8,1,sVar2,pAVar3);
        }
        local_98.cstep = 0;
        local_98.data = (Mat *)0x0;
        local_98.refcount._0_4_ = 0;
        local_98.refcount._4_4_ = 0;
        local_98.elemsize._0_4_ = 0;
        local_98.elemsize._4_4_ = 0;
        local_98.elempack = 0;
        local_98.allocator = (Allocator *)0x0;
        local_98.dims = 0;
        local_98.w = 0;
        local_98.h = 0;
        local_98.d = 0;
        local_98.c = 0;
        pMVar28 = (Mat *)0x1;
        Mat::create(&local_98,1,uVar8,uVar10,sVar2,
                    *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
        sVar2 = local_98.cstep;
        pMVar17 = (Mat *)local_98.data;
        iVar35 = -100;
        if (((Mat *)local_98.data != (Mat *)0x0) && (local_98.cstep * (long)local_98.c != 0)) {
          uVar7 = (int)local_98.cstep * local_98.c;
          if (0 < (int)uVar7) {
            pMVar28 = (Mat *)0x0;
            memset(local_98.data,0,(ulong)uVar7 << 2);
          }
          if (0 < (int)uVar10) {
            pvVar14 = a->data;
            sVar38 = a->elemsize;
            sVar29 = a->cstep;
            pMVar28 = (Mat *)((long)(int)uVar37 * 4);
            pMVar18 = (Mat *)0x0;
            do {
              if (0 < (int)uVar8) {
                pMVar20 = (Mat *)0x0;
                pvVar31 = pvVar14;
                do {
                  fVar40 = 0.0;
                  if (0 < (int)uVar37) {
                    uVar34 = 0;
                    do {
                      fVar40 = fVar40 + ABS(*(float *)((long)pvVar31 + uVar34 * 4));
                      uVar34 = uVar34 + 1;
                    } while (uVar37 != uVar34);
                  }
                  *(float *)((long)&pMVar17->data +
                            (long)pMVar20 * 4 +
                            CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) * sVar2
                            * (long)pMVar18) = fVar40;
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  pvVar31 = (void *)((long)&pMVar28->data + (long)pvVar31);
                } while (pMVar20 != pMVar16);
              }
              pMVar18 = (Mat *)((long)&pMVar18->data + 1);
              pvVar14 = (void *)((long)pvVar14 + sVar38 * sVar29);
            } while (pMVar18 != pMVar11);
          }
          uVar7 = b->c * (int)b->cstep;
          if (0 < (int)uVar7) {
            pMVar28 = (Mat *)0x0;
            memset(b->data,0,(ulong)uVar7 << 2);
          }
          if (0 < (int)uVar10) {
            pvVar14 = b->data;
            pMVar18 = (Mat *)0x0;
            do {
              if (0 < (int)uVar8) {
                pMVar20 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar14 + (long)pMVar20 * 4) =
                       *(float *)((long)&pMVar17->data + (long)pMVar20 * 4) +
                       *(float *)((long)pvVar14 + (long)pMVar20 * 4);
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                } while (pMVar16 != pMVar20);
              }
              pMVar18 = (Mat *)((long)&pMVar18->data + 1);
              pMVar17 = (Mat *)((long)&pMVar17->data +
                               sVar2 * CONCAT44(local_98.elemsize._4_4_,
                                                (undefined4)local_98.elemsize));
            } while (pMVar18 != pMVar11);
          }
          iVar35 = 0;
        }
        piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            pMVar28 = (Mat *)local_98.data;
            if (local_98.allocator == (Allocator *)0x0) {
              if ((Mat *)local_98.data != (Mat *)0x0) {
                free(local_98.data);
              }
            }
            else {
              (*(local_98.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        pMVar18 = (Mat *)(ulong)uVar7;
        if (((reduce_w && !reduce_h) && !bVar6) && !bVar32) {
          pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
          if (_post_process == 0) {
            Mat::create(b,uVar9,sVar2,pAVar3);
          }
          else {
            Mat::create(b,1,uVar9,1,1,sVar2,pAVar3);
          }
          local_98.cstep = 0;
          local_98.data = (Mat *)0x0;
          local_98.refcount._0_4_ = 0;
          local_98.refcount._4_4_ = 0;
          local_98.elemsize._0_4_ = 0;
          local_98.elemsize._4_4_ = 0;
          local_98.elempack = 0;
          local_98.allocator = (Allocator *)0x0;
          local_98.dims = 0;
          local_98.w = 0;
          local_98.h = 0;
          local_98.d = 0;
          local_98.c = 0;
          pMVar28 = (Mat *)0x1;
          Mat::create(&local_98,1,uVar9,uVar10,sVar2,
                      *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
          sVar2 = local_98.cstep;
          pMVar16 = (Mat *)local_98.data;
          iVar35 = -100;
          if (((Mat *)local_98.data != (Mat *)0x0) && (local_98.cstep * (long)local_98.c != 0)) {
            uVar36 = (int)local_98.cstep * local_98.c;
            if (0 < (int)uVar36) {
              pMVar28 = (Mat *)0x0;
              memset(local_98.data,0,(ulong)uVar36 << 2);
            }
            if (0 < (int)uVar10) {
              pvVar14 = a->data;
              sVar38 = a->elemsize;
              sVar29 = a->cstep;
              pMVar28 = (Mat *)(lVar22 * 4);
              pMVar20 = (Mat *)0x0;
              do {
                if (0 < (int)uVar8) {
                  lVar22 = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) * sVar2 *
                           (long)pMVar20;
                  pvVar31 = (void *)(sVar38 * sVar29 * (long)pMVar20 + (long)pvVar14);
                  uVar36 = 0;
                  do {
                    if (0 < (int)uVar9) {
                      pMVar24 = (Mat *)0x0;
                      do {
                        if (0 < (int)uVar7) {
                          fVar40 = *(float *)((long)&pMVar16->data + (long)pMVar24 * 4 + lVar22);
                          pMVar19 = (Mat *)0x0;
                          do {
                            fVar40 = fVar40 + ABS(*(float *)((long)pvVar31 + (long)pMVar19 * 4));
                            *(float *)((long)&pMVar16->data + (long)pMVar24 * 4 + lVar22) = fVar40;
                            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                          } while (pMVar18 != pMVar19);
                        }
                        pvVar31 = (void *)((long)&pMVar28->data + (long)pvVar31);
                        pMVar24 = (Mat *)((long)&pMVar24->data + 1);
                      } while (pMVar24 != pMVar17);
                    }
                    uVar36 = uVar36 + 1;
                  } while (uVar36 != uVar8);
                }
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              } while (pMVar20 != pMVar11);
            }
            uVar7 = b->c * (int)b->cstep;
            if (0 < (int)uVar7) {
              pMVar28 = (Mat *)0x0;
              memset(b->data,0,(ulong)uVar7 << 2);
            }
            if (0 < (int)uVar10) {
              pMVar28 = (Mat *)(sVar2 * CONCAT44(local_98.elemsize._4_4_,
                                                 (undefined4)local_98.elemsize));
              pvVar14 = b->data;
              pMVar18 = (Mat *)0x0;
              do {
                if (0 < (int)uVar9) {
                  pMVar20 = (Mat *)0x0;
                  do {
                    *(float *)((long)pvVar14 + (long)pMVar20 * 4) =
                         *(float *)((long)&pMVar16->data + (long)pMVar20 * 4) +
                         *(float *)((long)pvVar14 + (long)pMVar20 * 4);
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  } while (pMVar17 != pMVar20);
                }
                pMVar18 = (Mat *)((long)&pMVar18->data + 1);
                pMVar16 = (Mat *)((long)&pMVar28->data + (long)&pMVar16->data);
              } while (pMVar18 != pMVar11);
            }
            iVar35 = 0;
          }
          piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_98.allocator == (Allocator *)0x0) goto LAB_003497d3;
              pMVar28 = (Mat *)local_98.data;
              (*(local_98.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        else {
          bVar26 = bVar27 | reduce_w;
          if ((bVar26 == 0 && !bVar6) && !bVar32) {
            pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
            if (_post_process == 0) {
              Mat::create(b,uVar7,sVar2,pAVar3);
            }
            else {
              Mat::create(b,uVar7,1,1,1,sVar2,pAVar3);
            }
            local_98.cstep = 0;
            local_98.data = (Mat *)0x0;
            local_98.refcount._0_4_ = 0;
            local_98.refcount._4_4_ = 0;
            local_98.elemsize._0_4_ = 0;
            local_98.elemsize._4_4_ = 0;
            local_98.elempack = 0;
            local_98.allocator = (Allocator *)0x0;
            local_98.dims = 0;
            local_98.w = 0;
            local_98.h = 0;
            local_98.d = 0;
            local_98.c = 0;
            pMVar28 = (Mat *)(ulong)uVar7;
            Mat::create(&local_98,uVar7,1,uVar10,sVar2,
                        *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
            sVar2 = local_98.cstep;
            pMVar16 = (Mat *)local_98.data;
            iVar35 = -100;
            if (((Mat *)local_98.data != (Mat *)0x0) && (local_98.cstep * (long)local_98.c != 0)) {
              uVar36 = (int)local_98.cstep * local_98.c;
              if (0 < (int)uVar36) {
                pMVar28 = (Mat *)0x0;
                memset(local_98.data,0,(ulong)uVar36 << 2);
              }
              if (0 < (int)uVar10) {
                sVar38 = a->elemsize;
                sVar29 = a->cstep;
                pvVar14 = a->data;
                pMVar28 = (Mat *)(CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) *
                                 sVar2);
                pMVar20 = (Mat *)0x0;
                pMVar17 = pMVar16;
                do {
                  if (0 < (int)uVar8) {
                    pvVar31 = (void *)(sVar38 * sVar29 * (long)pMVar20 + (long)pvVar14);
                    uVar36 = 0;
                    do {
                      if (0 < (int)uVar9) {
                        uVar37 = 0;
                        do {
                          if (0 < (int)uVar7) {
                            pMVar24 = (Mat *)0x0;
                            do {
                              *(float *)((long)&pMVar17->data + (long)pMVar24 * 4) =
                                   ABS(*(float *)((long)pvVar31 + (long)pMVar24 * 4)) +
                                   *(float *)((long)&pMVar17->data + (long)pMVar24 * 4);
                              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
                            } while (pMVar18 != pMVar24);
                          }
                          pvVar31 = (void *)((long)pvVar31 + lVar22 * 4);
                          uVar37 = uVar37 + 1;
                        } while (uVar37 != uVar9);
                      }
                      uVar36 = uVar36 + 1;
                    } while (uVar36 != uVar8);
                  }
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                  pMVar17 = (Mat *)((long)&pMVar28->data + (long)&pMVar17->data);
                } while (pMVar20 != pMVar11);
              }
              uVar9 = b->c * (int)b->cstep;
              if (0 < (int)uVar9) {
                pMVar28 = (Mat *)0x0;
                memset(b->data,0,(ulong)uVar9 << 2);
              }
              if (0 < (int)uVar10) {
                pMVar28 = (Mat *)(sVar2 * CONCAT44(local_98.elemsize._4_4_,
                                                   (undefined4)local_98.elemsize));
                pvVar14 = b->data;
                pMVar17 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar7) {
                    pMVar20 = (Mat *)0x0;
                    do {
                      *(float *)((long)pvVar14 + (long)pMVar20 * 4) =
                           *(float *)((long)&pMVar16->data + (long)pMVar20 * 4) +
                           *(float *)((long)pvVar14 + (long)pMVar20 * 4);
                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    } while (pMVar18 != pMVar20);
                  }
                  pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                  pMVar16 = (Mat *)((long)&pMVar28->data + (long)&pMVar16->data);
                } while (pMVar17 != pMVar11);
              }
              iVar35 = 0;
            }
            piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_98.allocator == (Allocator *)0x0) goto LAB_003497d3;
                pMVar28 = (Mat *)local_98.data;
                (*(local_98.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          else {
            if (((reduce_w && bVar27 == 0) && !reduce_d) && !reduce_c) {
              pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
              if (_post_process == 0) {
                pMVar28 = pMVar16;
                Mat::create(b,uVar8,uVar10,sVar2,pAVar3);
              }
              else {
                pMVar28 = (Mat *)0x1;
                Mat::create(b,1,1,uVar8,uVar10,sVar2,pAVar3);
              }
              if (0 < (int)uVar10) {
                sVar2 = a->elemsize;
                if (_post_process == 0) {
                  sVar38 = (size_t)b->w;
                }
                else {
                  sVar38 = b->cstep;
                }
                pMVar28 = (Mat *)a->data;
                pvVar14 = b->data;
                sVar29 = b->elemsize;
                sVar4 = a->cstep;
                pMVar17 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar8) {
                    pMVar20 = (Mat *)0x0;
                    pMVar18 = pMVar28;
                    do {
                      fVar40 = 0.0;
                      if (0 < (int)uVar37) {
                        uVar34 = 0;
                        do {
                          fVar40 = fVar40 + ABS(*(float *)((long)&pMVar18->data + uVar34 * 4));
                          uVar34 = uVar34 + 1;
                        } while (uVar37 != uVar34);
                      }
                      *(float *)((long)pvVar14 + (long)pMVar20 * 4 + sVar38 * sVar29 * (long)pMVar17
                                ) = fVar40;
                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                      pMVar18 = (Mat *)((long)&pMVar18->data + (long)(int)uVar37 * 4);
                    } while (pMVar20 != pMVar16);
                  }
                  pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                  pMVar28 = (Mat *)((long)&pMVar28->data + sVar2 * sVar4);
                } while (pMVar17 != pMVar11);
              }
              goto LAB_003497f4;
            }
            if (((reduce_w && !reduce_h) && !reduce_d) && !bVar32) {
              pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
              if (_post_process == 0) {
                Mat::create(b,uVar9,uVar8,sVar2,pAVar3);
              }
              else {
                Mat::create(b,1,uVar9,uVar8,1,sVar2,pAVar3);
              }
              local_98.cstep = 0;
              local_98.data = (Mat *)0x0;
              local_98.refcount._0_4_ = 0;
              local_98.refcount._4_4_ = 0;
              local_98.elemsize._0_4_ = 0;
              local_98.elemsize._4_4_ = 0;
              local_98.elempack = 0;
              local_98.allocator = (Allocator *)0x0;
              local_98.dims = 0;
              local_98.w = 0;
              local_98.h = 0;
              local_98.d = 0;
              local_98.c = 0;
              pMVar28 = pMVar17;
              Mat::create(&local_98,uVar9,uVar8,uVar10,sVar2,
                          *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
              sVar2 = local_98.cstep;
              pMVar20 = (Mat *)local_98.data;
              iVar35 = -100;
              if (((Mat *)local_98.data != (Mat *)0x0) &&
                 (pMVar28 = (Mat *)local_98.cstep, local_98.cstep * (long)local_98.c != 0)) {
                uVar36 = (int)local_98.cstep * local_98.c;
                if (0 < (int)uVar36) {
                  pMVar28 = (Mat *)0x0;
                  memset(local_98.data,0,(ulong)uVar36 << 2);
                }
                if (0 < (int)uVar10) {
                  pvVar14 = a->data;
                  sVar38 = a->elemsize;
                  sVar29 = a->cstep;
                  pMVar28 = (Mat *)(CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize)
                                   * sVar2);
                  pMVar24 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar8) {
                      pvVar31 = (void *)(sVar38 * sVar29 * (long)pMVar24 + (long)pvVar14);
                      pMVar19 = (Mat *)0x0;
                      do {
                        if (0 < (int)uVar9) {
                          lVar39 = (long)local_98.w *
                                   CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) *
                                   (long)pMVar19 + (long)pMVar28 * (long)pMVar24;
                          pMVar13 = (Mat *)0x0;
                          do {
                            if (0 < (int)uVar7) {
                              fVar40 = *(float *)((long)&pMVar20->data + (long)pMVar13 * 4 + lVar39)
                              ;
                              pMVar12 = (Mat *)0x0;
                              do {
                                fVar40 = fVar40 + ABS(*(float *)((long)pvVar31 + (long)pMVar12 * 4))
                                ;
                                *(float *)((long)&pMVar20->data + (long)pMVar13 * 4 + lVar39) =
                                     fVar40;
                                pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                              } while (pMVar18 != pMVar12);
                            }
                            pvVar31 = (void *)((long)pvVar31 + lVar22 * 4);
                            pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                          } while (pMVar13 != pMVar17);
                        }
                        pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                      } while (pMVar19 != pMVar16);
                    }
                    pMVar24 = (Mat *)((long)&pMVar24->data + 1);
                  } while (pMVar24 != pMVar11);
                }
                uVar7 = b->c * (int)b->cstep;
                if (0 < (int)uVar7) {
                  pMVar28 = (Mat *)0x0;
                  memset(b->data,0,(ulong)uVar7 << 2);
                }
                if (0 < (int)uVar10) {
                  pMVar18 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar8) {
                      iVar35 = 1;
                      if (_post_process != 0) {
                        iVar35 = b->h;
                      }
                      iVar1 = b->w;
                      sVar38 = b->elemsize;
                      pMVar28 = (Mat *)b->data;
                      pMVar19 = (Mat *)0x0;
                      pMVar24 = pMVar20;
                      do {
                        if (0 < (int)uVar9) {
                          pMVar13 = (Mat *)0x0;
                          do {
                            *(float *)((long)&pMVar28->data + (long)pMVar13 * 4) =
                                 *(float *)((long)&pMVar24->data + (long)pMVar13 * 4) +
                                 *(float *)((long)&pMVar28->data + (long)pMVar13 * 4);
                            pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                          } while (pMVar17 != pMVar13);
                        }
                        pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                        pMVar24 = (Mat *)((long)&pMVar24->data +
                                         (long)local_98.w *
                                         CONCAT44(local_98.elemsize._4_4_,
                                                  (undefined4)local_98.elemsize));
                        pMVar28 = (Mat *)((long)&pMVar28->data + (long)iVar35 * sVar38 * (long)iVar1
                                         );
                      } while (pMVar19 != pMVar16);
                    }
                    pMVar18 = (Mat *)((long)&pMVar18->data + 1);
                    pMVar20 = (Mat *)((long)&pMVar20->data +
                                     sVar2 * CONCAT44(local_98.elemsize._4_4_,
                                                      (undefined4)local_98.elemsize));
                  } while (pMVar18 != pMVar11);
                }
                iVar35 = 0;
              }
              piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  pMVar28 = (Mat *)local_98.data;
                  if (local_98.allocator == (Allocator *)0x0) {
                    if ((Mat *)local_98.data != (Mat *)0x0) {
                      free(local_98.data);
                    }
                  }
                  else {
                    (*(local_98.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            else if ((bVar6 || (reduce_w || reduce_h)) || bVar32) {
              if (((reduce_w && !reduce_h) && !bVar6) && !reduce_c) {
                pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
                if (_post_process == 0) {
                  pMVar28 = (Mat *)(ulong)uVar9;
                  Mat::create(b,uVar9,uVar10,sVar2,pAVar3);
                }
                else {
                  pMVar28 = (Mat *)0x1;
                  Mat::create(b,1,uVar9,1,uVar10,sVar2,pAVar3);
                }
                if (0 < (int)uVar10) {
                  sVar2 = a->elemsize;
                  if (_post_process == 0) {
                    sVar38 = (size_t)b->w;
                  }
                  else {
                    sVar38 = b->cstep;
                  }
                  pvVar14 = a->data;
                  sVar29 = a->cstep;
                  pvVar31 = b->data;
                  pvVar30 = (void *)(sVar38 * b->elemsize);
                  pMVar16 = (Mat *)0x0;
                  local_48 = pvVar30;
                  do {
                    pvVar23 = (void *)((long)pvVar30 * (long)pMVar16 + (long)pvVar31);
                    if (0 < (int)uVar9) {
                      pMVar28 = (Mat *)0x0;
                      memset(pvVar23,0,(long)pMVar17 * 4);
                      pvVar30 = local_48;
                    }
                    if (0 < (int)uVar8) {
                      pvVar15 = (void *)(sVar2 * sVar29 * (long)pMVar16 + (long)pvVar14);
                      uVar10 = 0;
                      do {
                        if (0 < (int)uVar9) {
                          pMVar20 = (Mat *)0x0;
                          do {
                            if (0 < (int)uVar7) {
                              fVar40 = *(float *)((long)pvVar23 + (long)pMVar20 * 4);
                              pMVar28 = (Mat *)0x0;
                              do {
                                fVar40 = fVar40 + ABS(*(float *)((long)pvVar15 + (long)pMVar28 * 4))
                                ;
                                *(float *)((long)pvVar23 + (long)pMVar20 * 4) = fVar40;
                                pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                              } while (pMVar18 != pMVar28);
                            }
                            pvVar15 = (void *)((long)pvVar15 + lVar22 * 4);
                            pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                          } while (pMVar20 != pMVar17);
                        }
                        uVar10 = uVar10 + 1;
                      } while (uVar10 != uVar8);
                    }
                    pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                  } while (pMVar16 != pMVar11);
                }
                goto LAB_003497f4;
              }
              pMVar28 = pMVar18;
              if ((bVar26 | reduce_d) != 0 || bVar32) {
                if ((bVar26 == 0 && !bVar6) && !reduce_c) {
                  pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
                  if (_post_process == 0) {
                    Mat::create(b,uVar7,uVar10,sVar2,pAVar3);
                  }
                  else {
                    pMVar28 = (Mat *)(ulong)uVar7;
                    Mat::create(b,uVar7,1,1,uVar10,sVar2,pAVar3);
                  }
                  if (0 < (int)uVar10) {
                    sVar2 = a->elemsize;
                    if (_post_process == 0) {
                      sVar38 = (size_t)b->w;
                    }
                    else {
                      sVar38 = b->cstep;
                    }
                    pvVar14 = a->data;
                    sVar29 = a->cstep;
                    pvVar31 = b->data;
                    lVar39 = sVar38 * b->elemsize;
                    pMVar16 = (Mat *)0x0;
                    local_48 = pvVar31;
                    do {
                      if (0 < (int)uVar7) {
                        pMVar28 = (Mat *)0x0;
                        memset((void *)(lVar39 * (long)pMVar16 + (long)local_48),0,(long)pMVar18 * 4
                              );
                      }
                      if (0 < (int)uVar8) {
                        pvVar30 = (void *)(sVar2 * sVar29 * (long)pMVar16 + (long)pvVar14);
                        uVar10 = 0;
                        do {
                          if (0 < (int)uVar9) {
                            uVar36 = 0;
                            do {
                              if (0 < (int)uVar7) {
                                pMVar28 = (Mat *)0x0;
                                do {
                                  *(float *)((long)pvVar31 + (long)pMVar28 * 4) =
                                       ABS(*(float *)((long)pvVar30 + (long)pMVar28 * 4)) +
                                       *(float *)((long)pvVar31 + (long)pMVar28 * 4);
                                  pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                                } while (pMVar18 != pMVar28);
                              }
                              pvVar30 = (void *)((long)pvVar30 + lVar22 * 4);
                              uVar36 = uVar36 + 1;
                            } while (uVar36 != uVar9);
                          }
                          uVar10 = uVar10 + 1;
                        } while (uVar10 != uVar8);
                      }
                      pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                      pvVar31 = (void *)((long)pvVar31 + lVar39);
                    } while (pMVar16 != pMVar11);
                  }
                }
                else if (((reduce_w && !reduce_h) && !reduce_d) && !reduce_c) {
                  pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
                  if (_post_process == 0) {
                    pMVar28 = (Mat *)(ulong)uVar9;
                    Mat::create(b,uVar9,uVar8,uVar10,sVar2,pAVar3);
                  }
                  else {
                    pMVar28 = (Mat *)0x1;
                    Mat::create(b,1,uVar9,uVar8,uVar10,sVar2,pAVar3);
                  }
                  if (0 < (int)uVar10) {
                    pvVar14 = a->data;
                    sVar2 = a->elemsize;
                    sVar38 = b->elemsize;
                    sVar29 = b->cstep;
                    pMVar28 = (Mat *)b->data;
                    sVar4 = a->cstep;
                    pMVar16 = (Mat *)0x0;
                    do {
                      if (0 < (int)(uVar9 * uVar8)) {
                        uVar34 = 0;
                        pvVar31 = pvVar14;
                        do {
                          fVar40 = 0.0;
                          if (0 < (int)uVar7) {
                            pMVar17 = (Mat *)0x0;
                            do {
                              fVar40 = fVar40 + ABS(*(float *)((long)pvVar31 + (long)pMVar17 * 4));
                              pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                            } while (pMVar18 != pMVar17);
                          }
                          *(float *)((long)&pMVar28->data +
                                    uVar34 * 4 + sVar38 * sVar29 * (long)pMVar16) = fVar40;
                          uVar34 = uVar34 + 1;
                          pvVar31 = (void *)((long)pvVar31 + lVar22 * 4);
                        } while (uVar34 != uVar9 * uVar8);
                      }
                      pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                      pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar4);
                    } while (pMVar16 != pMVar11);
                  }
                }
                else if (((reduce_w || reduce_h) || reduce_d) || bVar32) {
                  bVar27 = bVar26 | reduce_d | reduce_c;
                  if (bVar27 == 0) {
                    pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
                    if (_post_process == 0) {
                      Mat::create(b,uVar7,uVar8,uVar10,sVar2,pAVar3);
                    }
                    else {
                      pMVar28 = (Mat *)(ulong)uVar7;
                      Mat::create(b,uVar7,1,uVar8,uVar10,sVar2,pAVar3);
                    }
                    if (0 < (int)uVar10) {
                      pvVar14 = a->data;
                      sVar2 = a->elemsize;
                      sVar38 = a->cstep;
                      iVar35 = b->w;
                      pvVar31 = b->data;
                      uVar34 = b->elemsize;
                      lVar22 = b->cstep * uVar34;
                      pMVar28 = (Mat *)((long)b->h * (long)iVar35);
                      pMVar17 = (Mat *)0x0;
                      iVar1 = (int)((uVar34 * (long)pMVar28 + 0xf & 0xfffffffffffffff0) / uVar34);
                      if (b->dims == 4) {
                        iVar1 = (int)pMVar28;
                      }
                      uVar10 = iVar1 * b->d;
                      local_40 = (ulong)uVar10 * 4;
                      local_48 = pvVar31;
                      do {
                        if (0 < (int)uVar10) {
                          pMVar28 = (Mat *)0x0;
                          memset((void *)(lVar22 * (long)pMVar17 + (long)local_48),0,local_40);
                        }
                        if (0 < (int)uVar8) {
                          pvVar23 = (void *)(sVar2 * sVar38 * (long)pMVar17 + (long)pvVar14);
                          pMVar20 = (Mat *)0x0;
                          pvVar30 = pvVar31;
                          do {
                            if (0 < (int)uVar9) {
                              pMVar28 = (Mat *)0x0;
                              do {
                                if (0 < (int)uVar7) {
                                  pMVar24 = (Mat *)0x0;
                                  do {
                                    *(float *)((long)pvVar30 + (long)pMVar24 * 4) =
                                         ABS(*(float *)((long)pvVar23 + (long)pMVar24 * 4)) +
                                         *(float *)((long)pvVar30 + (long)pMVar24 * 4);
                                    pMVar24 = (Mat *)((long)&pMVar24->data + 1);
                                  } while (pMVar18 != pMVar24);
                                }
                                pvVar23 = (void *)((long)pvVar23 + (long)(int)uVar7 * 4);
                                uVar36 = (int)pMVar28 + 1;
                                pMVar28 = (Mat *)(ulong)uVar36;
                              } while (uVar36 != uVar9);
                            }
                            pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                            pvVar30 = (void *)((long)pvVar30 + uVar34 * (long)iVar35);
                          } while (pMVar20 != pMVar16);
                        }
                        pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                        pvVar31 = (void *)((long)pvVar31 + lVar22);
                      } while (pMVar17 != pMVar11);
                    }
                  }
                  else {
                    pMVar28 = (Mat *)CONCAT71((int7)(uVar34 >> 8),bVar27);
                    if ((!bVar6 && (!reduce_w && !reduce_h)) && !reduce_c) {
                      pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
                      if (_post_process == 0) {
                        pMVar28 = pMVar18;
                        Mat::create(b,uVar7,uVar9,uVar10,sVar2,pAVar3);
                      }
                      else {
                        pMVar28 = pMVar18;
                        Mat::create(b,uVar7,uVar9,1,uVar10,sVar2,pAVar3);
                      }
                      if (0 < (int)uVar10) {
                        pvVar14 = a->data;
                        sVar2 = a->elemsize;
                        sVar38 = a->cstep;
                        iVar35 = b->w;
                        pvVar31 = b->data;
                        uVar34 = b->elemsize;
                        pvVar30 = (void *)(b->cstep * uVar34);
                        pMVar28 = (Mat *)((long)b->h * (long)iVar35);
                        pMVar16 = (Mat *)0x0;
                        iVar1 = (int)((uVar34 * (long)pMVar28 + 0xf & 0xfffffffffffffff0) / uVar34);
                        if (b->dims == 4) {
                          iVar1 = (int)pMVar28;
                        }
                        uVar10 = iVar1 * b->d;
                        local_40 = (ulong)uVar10 * 4;
                        pvVar23 = pvVar31;
                        local_48 = pvVar30;
                        do {
                          if (0 < (int)uVar10) {
                            pMVar28 = (Mat *)0x0;
                            memset((void *)((long)pvVar30 * (long)pMVar16 + (long)pvVar31),0,
                                   local_40);
                            pvVar30 = local_48;
                          }
                          if (0 < (int)uVar8) {
                            pvVar15 = (void *)(sVar2 * sVar38 * (long)pMVar16 + (long)pvVar14);
                            uVar36 = 0;
                            do {
                              if (0 < (int)uVar9) {
                                pMVar28 = (Mat *)0x0;
                                pvVar21 = pvVar23;
                                do {
                                  if (0 < (int)uVar7) {
                                    pMVar20 = (Mat *)0x0;
                                    do {
                                      *(float *)((long)pvVar21 + (long)pMVar20 * 4) =
                                           ABS(*(float *)((long)pvVar15 + (long)pMVar20 * 4)) +
                                           *(float *)((long)pvVar21 + (long)pMVar20 * 4);
                                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                                    } while (pMVar18 != pMVar20);
                                  }
                                  pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar7 * 4);
                                  pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                                  pvVar21 = (void *)((long)pvVar21 + uVar34 * (long)iVar35);
                                } while (pMVar28 != pMVar17);
                              }
                              uVar36 = uVar36 + 1;
                            } while (uVar36 != uVar8);
                          }
                          pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                          pvVar23 = (void *)((long)pvVar23 + (long)pvVar30);
                        } while (pMVar16 != pMVar11);
                      }
                    }
                  }
                }
                else {
                  pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
                  if (_post_process == 0) {
                    Mat::create(b,uVar7,uVar9,uVar8,sVar2,pAVar3);
                  }
                  else {
                    pMVar28 = (Mat *)(ulong)uVar7;
                    Mat::create(b,uVar7,uVar9,uVar8,1,sVar2,pAVar3);
                  }
                  uVar36 = b->c * (int)b->cstep;
                  if (0 < (int)uVar36) {
                    pMVar28 = (Mat *)0x0;
                    memset(b->data,0,(ulong)uVar36 << 2);
                  }
                  if (0 < (int)uVar10) {
                    sVar2 = a->elemsize;
                    sVar38 = a->cstep;
                    pvVar14 = a->data;
                    pMVar28 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar8) {
                        iVar35 = b->w;
                        if (_post_process == 0) {
                          sVar29 = b->cstep;
                        }
                        else {
                          sVar29 = (long)b->h * (long)iVar35;
                        }
                        pvVar30 = (void *)(sVar2 * sVar38 * (long)pMVar28 + (long)pvVar14);
                        pvVar31 = b->data;
                        sVar4 = b->elemsize;
                        pMVar20 = (Mat *)0x0;
                        do {
                          if (0 < (int)uVar9) {
                            pMVar24 = (Mat *)0x0;
                            pvVar23 = pvVar31;
                            do {
                              if (0 < (int)uVar7) {
                                pMVar19 = (Mat *)0x0;
                                do {
                                  *(float *)((long)pvVar23 + (long)pMVar19 * 4) =
                                       ABS(*(float *)((long)pvVar30 + (long)pMVar19 * 4)) +
                                       *(float *)((long)pvVar23 + (long)pMVar19 * 4);
                                  pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                                } while (pMVar18 != pMVar19);
                              }
                              pvVar30 = (void *)((long)pvVar30 + lVar22 * 4);
                              pMVar24 = (Mat *)((long)&pMVar24->data + 1);
                              pvVar23 = (void *)((long)pvVar23 + (long)iVar35 * sVar4);
                            } while (pMVar24 != pMVar17);
                          }
                          pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                          pvVar31 = (void *)((long)pvVar31 + sVar29 * sVar4);
                        } while (pMVar20 != pMVar16);
                      }
                      pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                    } while (pMVar28 != pMVar11);
                  }
                }
                goto LAB_003497f4;
              }
              pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
              if (_post_process == 0) {
                Mat::create(b,uVar7,uVar8,sVar2,pAVar3);
              }
              else {
                Mat::create(b,uVar7,1,uVar8,1,sVar2,pAVar3);
              }
              local_98.cstep = 0;
              local_98.data = (Mat *)0x0;
              local_98.refcount._0_4_ = 0;
              local_98.refcount._4_4_ = 0;
              local_98.elemsize._0_4_ = 0;
              local_98.elemsize._4_4_ = 0;
              local_98.elempack = 0;
              local_98.allocator = (Allocator *)0x0;
              local_98.dims = 0;
              local_98.w = 0;
              local_98.h = 0;
              local_98.d = 0;
              local_98.c = 0;
              Mat::create(&local_98,uVar7,uVar8,uVar10,sVar2,
                          *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
              sVar2 = local_98.cstep;
              pMVar17 = (Mat *)local_98.data;
              iVar35 = -100;
              if (((Mat *)local_98.data != (Mat *)0x0) &&
                 (iVar35 = -100, local_98.cstep * (long)local_98.c != 0)) {
                uVar36 = (int)local_98.cstep * local_98.c;
                if (0 < (int)uVar36) {
                  pMVar28 = (Mat *)0x0;
                  memset(local_98.data,0,(ulong)uVar36 << 2);
                }
                if (0 < (int)uVar10) {
                  pvVar14 = a->data;
                  sVar38 = a->elemsize;
                  sVar29 = a->cstep;
                  pMVar28 = (Mat *)(lVar22 * 4);
                  pMVar24 = (Mat *)0x0;
                  pMVar20 = pMVar17;
                  do {
                    if (0 < (int)uVar8) {
                      pvVar31 = (void *)(sVar38 * sVar29 * (long)pMVar24 + (long)pvVar14);
                      pMVar13 = (Mat *)0x0;
                      pMVar19 = pMVar20;
                      do {
                        if (0 < (int)uVar9) {
                          uVar36 = 0;
                          do {
                            if (0 < (int)uVar7) {
                              pMVar12 = (Mat *)0x0;
                              do {
                                *(float *)((long)&pMVar19->data + (long)pMVar12 * 4) =
                                     ABS(*(float *)((long)pvVar31 + (long)pMVar12 * 4)) +
                                     *(float *)((long)&pMVar19->data + (long)pMVar12 * 4);
                                pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                              } while (pMVar18 != pMVar12);
                            }
                            pvVar31 = (void *)((long)&pMVar28->data + (long)pvVar31);
                            uVar36 = uVar36 + 1;
                          } while (uVar36 != uVar9);
                        }
                        pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                        pMVar19 = (Mat *)((long)&pMVar19->data +
                                         (long)local_98.w *
                                         CONCAT44(local_98.elemsize._4_4_,
                                                  (undefined4)local_98.elemsize));
                      } while (pMVar13 != pMVar16);
                    }
                    pMVar24 = (Mat *)((long)&pMVar24->data + 1);
                    pMVar20 = (Mat *)((long)&pMVar20->data +
                                     CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize)
                                     * sVar2);
                  } while (pMVar24 != pMVar11);
                }
                uVar9 = b->c * (int)b->cstep;
                if (0 < (int)uVar9) {
                  pMVar28 = (Mat *)0x0;
                  memset(b->data,0,(ulong)uVar9 << 2);
                }
                if (0 < (int)uVar10) {
                  pvVar14 = b->data;
                  iVar35 = b->w;
                  sVar38 = b->elemsize;
                  pMVar28 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar8) {
                      pMVar24 = (Mat *)0x0;
                      pvVar31 = pvVar14;
                      pMVar20 = pMVar17;
                      do {
                        if (0 < (int)uVar7) {
                          pMVar19 = (Mat *)0x0;
                          do {
                            *(float *)((long)pvVar31 + (long)pMVar19 * 4) =
                                 *(float *)((long)&pMVar20->data + (long)pMVar19 * 4) +
                                 *(float *)((long)pvVar31 + (long)pMVar19 * 4);
                            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                          } while (pMVar18 != pMVar19);
                        }
                        pMVar24 = (Mat *)((long)&pMVar24->data + 1);
                        pMVar20 = (Mat *)((long)&pMVar20->data +
                                         (long)local_98.w *
                                         CONCAT44(local_98.elemsize._4_4_,
                                                  (undefined4)local_98.elemsize));
                        pvVar31 = (void *)((long)pvVar31 + (long)iVar35 * sVar38);
                      } while (pMVar24 != pMVar16);
                    }
                    pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                    pMVar17 = (Mat *)((long)&pMVar17->data +
                                     sVar2 * CONCAT44(local_98.elemsize._4_4_,
                                                      (undefined4)local_98.elemsize));
                  } while (pMVar28 != pMVar11);
                }
                iVar35 = 0;
              }
              piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  pMVar28 = (Mat *)local_98.data;
                  if (local_98.allocator == (Allocator *)0x0) {
                    if ((Mat *)local_98.data != (Mat *)0x0) {
                      free(local_98.data);
                    }
                  }
                  else {
                    (*(local_98.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            else {
              pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
              if (_post_process == 0) {
                Mat::create(b,uVar7,uVar9,sVar2,pAVar3);
              }
              else {
                Mat::create(b,uVar7,uVar9,1,1,sVar2,pAVar3);
              }
              local_98.cstep = 0;
              local_98.data = (Mat *)0x0;
              local_98.refcount._0_4_ = 0;
              local_98.refcount._4_4_ = 0;
              local_98.elemsize._0_4_ = 0;
              local_98.elemsize._4_4_ = 0;
              local_98.elempack = 0;
              local_98.allocator = (Allocator *)0x0;
              local_98.dims = 0;
              local_98.w = 0;
              local_98.h = 0;
              local_98.d = 0;
              local_98.c = 0;
              pMVar28 = (Mat *)(ulong)uVar7;
              Mat::create(&local_98,uVar7,uVar9,uVar10,sVar2,
                          *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
              sVar2 = local_98.cstep;
              pMVar16 = (Mat *)local_98.data;
              iVar35 = -100;
              if (((Mat *)local_98.data != (Mat *)0x0) && (local_98.cstep * (long)local_98.c != 0))
              {
                uVar36 = (int)local_98.cstep * local_98.c;
                if (0 < (int)uVar36) {
                  pMVar28 = (Mat *)0x0;
                  memset(local_98.data,0,(ulong)uVar36 << 2);
                }
                if (0 < (int)uVar10) {
                  pvVar14 = a->data;
                  sVar38 = a->elemsize;
                  sVar29 = a->cstep;
                  pMVar28 = (Mat *)(lVar22 * 4);
                  pMVar24 = (Mat *)0x0;
                  pMVar20 = pMVar16;
                  do {
                    if (0 < (int)uVar8) {
                      pvVar31 = (void *)(sVar38 * sVar29 * (long)pMVar24 + (long)pvVar14);
                      uVar36 = 0;
                      do {
                        if (0 < (int)uVar9) {
                          pMVar13 = (Mat *)0x0;
                          pMVar19 = pMVar20;
                          do {
                            if (0 < (int)uVar7) {
                              pMVar12 = (Mat *)0x0;
                              do {
                                *(float *)((long)&pMVar19->data + (long)pMVar12 * 4) =
                                     ABS(*(float *)((long)pvVar31 + (long)pMVar12 * 4)) +
                                     *(float *)((long)&pMVar19->data + (long)pMVar12 * 4);
                                pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                              } while (pMVar18 != pMVar12);
                            }
                            pvVar31 = (void *)((long)&pMVar28->data + (long)pvVar31);
                            pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                            pMVar19 = (Mat *)((long)&pMVar19->data +
                                             (long)local_98.w *
                                             CONCAT44(local_98.elemsize._4_4_,
                                                      (undefined4)local_98.elemsize));
                          } while (pMVar13 != pMVar17);
                        }
                        uVar36 = uVar36 + 1;
                      } while (uVar36 != uVar8);
                    }
                    pMVar24 = (Mat *)((long)&pMVar24->data + 1);
                    pMVar20 = (Mat *)((long)&pMVar20->data +
                                     CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize)
                                     * sVar2);
                  } while (pMVar24 != pMVar11);
                }
                uVar8 = b->c * (int)b->cstep;
                if (0 < (int)uVar8) {
                  pMVar28 = (Mat *)0x0;
                  memset(b->data,0,(ulong)uVar8 << 2);
                }
                if (0 < (int)uVar10) {
                  pvVar14 = b->data;
                  iVar35 = b->w;
                  sVar38 = b->elemsize;
                  pMVar28 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar9) {
                      pMVar24 = (Mat *)0x0;
                      pvVar31 = pvVar14;
                      pMVar20 = pMVar16;
                      do {
                        if (0 < (int)uVar7) {
                          pMVar19 = (Mat *)0x0;
                          do {
                            *(float *)((long)pvVar31 + (long)pMVar19 * 4) =
                                 *(float *)((long)&pMVar20->data + (long)pMVar19 * 4) +
                                 *(float *)((long)pvVar31 + (long)pMVar19 * 4);
                            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                          } while (pMVar18 != pMVar19);
                        }
                        pMVar24 = (Mat *)((long)&pMVar24->data + 1);
                        pMVar20 = (Mat *)((long)&pMVar20->data +
                                         (long)local_98.w *
                                         CONCAT44(local_98.elemsize._4_4_,
                                                  (undefined4)local_98.elemsize));
                        pvVar31 = (void *)((long)pvVar31 + (long)iVar35 * sVar38);
                      } while (pMVar24 != pMVar17);
                    }
                    pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                    pMVar16 = (Mat *)((long)&pMVar16->data +
                                     sVar2 * CONCAT44(local_98.elemsize._4_4_,
                                                      (undefined4)local_98.elemsize));
                  } while (pMVar28 != pMVar11);
                }
                iVar35 = 0;
              }
              piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  pMVar28 = (Mat *)local_98.data;
                  if (local_98.allocator == (Allocator *)0x0) {
                    if ((Mat *)local_98.data != (Mat *)0x0) {
                      free(local_98.data);
                    }
                  }
                  else {
                    (*(local_98.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (iVar35 != 0) {
    return -100;
  }
LAB_003497f4:
  if (1.1920929e-07 < ABS(local_34 + -1.0)) {
    reduction_post_process<ncnn::post_process_identity<float>>(b,local_34,(Option *)pMVar28);
  }
  return 0;
}

Assistant:

static int reduction(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_d, bool reduce_c, bool post_process, float coeff, int keepdims, const Option& opt)
{
    int ret = reduction_op<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_d, reduce_c, keepdims, opt);
    if (ret != 0)
        return -100;

    if (post_process || fabs(coeff - 1.f) > FLT_EPSILON)
    {
        ret = reduction_post_process<Op3>(b, coeff, opt);
        if (ret != 0)
            return -100;
    }

    return 0;
}